

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

XMLCh * xercesc_4_0::XMLString::makeUName(XMLCh *pszURI,XMLCh *pszName)

{
  short *psVar1;
  long lVar2;
  XMLCh *pXVar3;
  void *__dest;
  long lVar4;
  short sVar5;
  XMLCh XVar6;
  XMLCh *pXVar7;
  long lVar8;
  ulong uVar9;
  size_t __n;
  XMLCh szTmp [2];
  short sStack_12;
  
  lVar2 = 0;
  if (pszURI != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)pszURI + lVar2);
      lVar2 = lVar2 + 2;
    } while (*psVar1 != 0);
    lVar2 = (lVar2 >> 1) + -1;
  }
  if (lVar2 == 0) {
    if (pszName != (XMLCh *)0x0) {
      __n = 0;
      do {
        psVar1 = (short *)((long)pszName + __n);
        __n = __n + 2;
      } while (*psVar1 != 0);
      __dest = (void *)(**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                                 (XMLPlatformUtils::fgMemoryManager,__n);
      pXVar3 = (XMLCh *)memcpy(__dest,pszName,__n);
      return pXVar3;
    }
    pXVar3 = (XMLCh *)0x0;
  }
  else {
    lVar4 = 0;
    if (pszName != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)pszName + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
    }
    uVar9 = 0xffffffffffffffff;
    if (-1 < lVar2 + lVar4 + 3) {
      uVar9 = (lVar2 + lVar4) * 2 + 6;
    }
    pXVar3 = (XMLCh *)operator_new__(uVar9);
    sVar5 = 0x7b;
    lVar2 = 0;
    do {
      *(short *)((long)pXVar3 + lVar2) = sVar5;
      sVar5 = *(short *)((long)&sStack_12 + lVar2);
      lVar2 = lVar2 + 2;
    } while (sVar5 != 0);
    *(undefined2 *)((long)pXVar3 + lVar2) = 0;
    lVar2 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + lVar2);
      lVar2 = lVar2 + 2;
    } while (*psVar1 != 0);
    lVar2 = (lVar2 >> 1) + -1;
    XVar6 = *pszURI;
    if (XVar6 != L'\0') {
      pXVar7 = pszURI + 1;
      do {
        pXVar3[lVar2] = XVar6;
        lVar2 = lVar2 + 1;
        XVar6 = *pXVar7;
        pXVar7 = pXVar7 + 1;
      } while (XVar6 != L'\0');
    }
    pXVar3[lVar2] = L'\0';
    lVar2 = 0;
    do {
      lVar4 = lVar2;
      lVar2 = lVar4 + 2;
    } while (*(short *)((long)pXVar3 + lVar4) != 0);
    sVar5 = 0x7d;
    lVar2 = 0;
    do {
      lVar8 = lVar2;
      *(short *)((long)pXVar3 + lVar8 + lVar4) = sVar5;
      sVar5 = *(short *)((long)&sStack_12 + lVar8);
      lVar2 = lVar8 + 2;
    } while (sVar5 != 0);
    *(undefined2 *)((long)pXVar3 + lVar8 + (lVar4 + 2 >> 1) * 2) = 0;
    lVar2 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + lVar2);
      lVar2 = lVar2 + 2;
    } while (*psVar1 != 0);
    lVar2 = (lVar2 >> 1) + -1;
    XVar6 = *pszName;
    if (XVar6 != L'\0') {
      pXVar7 = pszName + 1;
      do {
        pXVar3[lVar2] = XVar6;
        lVar2 = lVar2 + 1;
        XVar6 = *pXVar7;
        pXVar7 = pXVar7 + 1;
      } while (XVar6 != L'\0');
    }
    pXVar3[lVar2] = L'\0';
  }
  return pXVar3;
}

Assistant:

XMLCh*
XMLString::makeUName(const XMLCh* const pszURI, const XMLCh* const pszName)
{
    //
    //  If there is a URI, then format out the full name in the {uri}name
    //  form. Otherwise, just set it to the same thing as the base name.
    //
    XMLCh* pszRet = 0;
    const XMLSize_t uriLen = stringLen(pszURI);
    if (uriLen)
    {
        pszRet = new XMLCh[uriLen + stringLen(pszName) + 3];

        XMLCh szTmp[2];
        szTmp[1] = 0;

        szTmp[0] = chOpenCurly;
        copyString(pszRet, szTmp);
        catString(pszRet, pszURI);
        szTmp[0] = chCloseCurly;
        catString(pszRet, szTmp);
        catString(pszRet, pszName);
    }
     else
    {
        pszRet = replicate(pszName);
    }
    return pszRet;
}